

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManCheckConst(Sbd_Man_t *p,int Pivot)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word *p_00;
  word *p_01;
  abctime aVar5;
  sat_solver *psVar6;
  abctime aVar7;
  Vec_Ptr_t *p_02;
  word *Entry;
  word **pVarSims;
  uint local_68;
  uint local_64;
  abctime clk;
  int nCares [2];
  int fFindOnset;
  int Ind;
  int iObj;
  int i;
  int RetValue;
  int PivotVar;
  word *pCtrl;
  word *pSims;
  Vec_Ptr_t *vSims;
  int nMintCount;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  p_00 = Sbd_ObjSim0(p,Pivot);
  p_01 = Sbd_ObjSim2(p,Pivot);
  iVar2 = Vec_IntEntry(p->vObj2Var,Pivot);
  memset(&clk,0,8);
  aVar5 = Abc_Clock();
  psVar6 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar6;
  aVar7 = Abc_Clock();
  p->timeCnf = (aVar7 - aVar5) + p->timeCnf;
  if (p->pSat == (sat_solver *)0x0) {
    Vec_IntWriteEntry(p->vLutLevs,Pivot,0);
    p->nLuts[0] = p->nLuts[0] + 1;
    p_local._4_4_ = 0;
  }
  else {
    Vec_IntClear(p->vLits);
    for (Ind = 0; Ind < 0x40; Ind = Ind + 1) {
      iVar3 = Abc_TtGetBit(p_01,Ind);
      if (iVar3 == 0) {
        Vec_IntPush(p->vLits,Ind);
      }
      else {
        iVar3 = Abc_TtGetBit(p_00,Ind);
        nCares[(long)iVar3 + -2] = nCares[(long)iVar3 + -2] + 1;
      }
    }
    nCares[0] = (int)((int)(uint)clk < (int)clk._4_4_);
    if (((int)(uint)clk < 1) || ((int)clk._4_4_ < 1)) {
      if ((int)(uint)clk < 1) {
        local_64 = 1 - (uint)clk;
      }
      else {
        local_64 = 0;
      }
      clk._0_4_ = local_64;
      if ((int)clk._4_4_ < 1) {
        local_68 = 1 - clk._4_4_;
      }
      else {
        local_68 = 0;
      }
      clk._4_4_ = local_68;
      if (p->pPars->fVeryVerbose != 0) {
        printf("Computing %d offset and %d onset minterms for node %d.\n",(ulong)local_64,
               (ulong)local_68,(ulong)(uint)Pivot);
      }
      iVar3 = Vec_IntSize(p->vLits);
      if (iVar3 < (int)((uint)clk + clk._4_4_)) {
        Ind = 0;
        while( true ) {
          bVar1 = false;
          if (Ind < 0x40) {
            iVar3 = Vec_IntSize(p->vLits);
            bVar1 = iVar3 < (int)((uint)clk + clk._4_4_);
          }
          iVar3 = nCares[0];
          if (!bVar1) break;
          iVar4 = Abc_TtGetBit(p_00,Ind);
          if (iVar3 == iVar4) {
            Vec_IntPush(p->vLits,Ind);
          }
          Ind = Ind + 1;
        }
      }
      else {
        Vec_IntShrink(p->vLits,(uint)clk + clk._4_4_);
      }
      p_02 = Vec_PtrAlloc(iVar2 + 1);
      for (Ind = 0; iVar3 = Vec_IntSize(p->vWinObjs), Ind < iVar3; Ind = Ind + 1) {
        iVar3 = Vec_IntEntry(p->vWinObjs,Ind);
        Entry = Sbd_ObjSim0(p,iVar3);
        Vec_PtrPush(p_02,Entry);
        if (iVar3 == Pivot) break;
      }
      if (Ind != iVar2) {
        __assert_fail("i == PivotVar",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                      ,0x240,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
      }
      psVar6 = p->pSat;
      pVarSims = (word **)Vec_PtrArray(p_02);
      p_local._4_4_ = Sbd_ManCollectConstants(psVar6,(int *)&clk,iVar2,pVarSims,p->vLits);
      Vec_PtrFree(p_02);
      if ((int)p_local._4_4_ < 0) {
        for (Ind = 0; iVar2 = Vec_IntSize(p->vLits), Ind < iVar2; Ind = Ind + 1) {
          nCares[1] = Vec_IntEntry(p->vLits,Ind);
          Abc_TtSetBit(p_01,nCares[1]);
        }
        Sbd_ManPropagateControl(p,Pivot);
        for (Ind = 0; Ind < 0x40; Ind = Ind + 1) {
          iVar2 = Abc_TtGetBit(p_01,Ind);
          if (iVar2 != 0) {
            iVar2 = Abc_TtGetBit(p_00,Ind);
            nCares[(long)iVar2 + -2] = nCares[(long)iVar2 + -2] + 1;
          }
        }
        if (((int)(uint)clk < 1) || ((int)clk._4_4_ < 1)) {
          __assert_fail("nCares[0] >= nMintCount && nCares[1] >= nMintCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                        ,0x262,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
        }
        p_local._4_4_ = 0xffffffff;
      }
      else {
        if (p->pPars->fVeryVerbose != 0) {
          printf("Found stuck-at-%d node %d.\n",(ulong)p_local._4_4_,(ulong)(uint)Pivot);
        }
        Vec_IntWriteEntry(p->vLutLevs,Pivot,0);
        p->nLuts[0] = p->nLuts[0] + 1;
      }
    }
    else {
      p_local._4_4_ = 0xffffffff;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManCheckConst( Sbd_Man_t * p, int Pivot )
{
    int nMintCount = 1;
    Vec_Ptr_t * vSims;
    word * pSims = Sbd_ObjSim0( p, Pivot );
    word * pCtrl = Sbd_ObjSim2( p, Pivot );
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int RetValue, i, iObj, Ind, fFindOnset, nCares[2] = {0};

    abctime clk = Abc_Clock();
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;
    if ( p->pSat == NULL )
    {
        //if ( p->pPars->fVerbose )
        //    printf( "Found stuck-at-%d node %d.\n", 0, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return 0;
    }
    //return -1;
    //Sbd_ManPrintObj( p, Pivot );

    // count the number of on-set and off-set care-set minterms
    Vec_IntClear( p->vLits );
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
        else
            Vec_IntPush( p->vLits, i );
    fFindOnset = (int)(nCares[0] < nCares[1]);
    if ( nCares[0] >= nMintCount && nCares[1] >= nMintCount )
        return -1;
    // find how many do we need
    nCares[0] = nCares[0] < nMintCount ? nMintCount - nCares[0] : 0;
    nCares[1] = nCares[1] < nMintCount ? nMintCount - nCares[1] : 0;

    if ( p->pPars->fVeryVerbose )
        printf( "Computing %d offset and %d onset minterms for node %d.\n", nCares[0], nCares[1], Pivot );

    if ( Vec_IntSize(p->vLits) >= nCares[0] + nCares[1] )
        Vec_IntShrink( p->vLits, nCares[0] + nCares[1] );
    else
    {
        // collect places to insert new minterms
        for ( i = 0; i < 64 && Vec_IntSize(p->vLits) < nCares[0] + nCares[1]; i++ )
            if ( fFindOnset == Abc_TtGetBit(pSims, i) )
                Vec_IntPush( p->vLits, i );
    }
    // collect simulation pointers
    vSims = Vec_PtrAlloc( PivotVar + 1 );
    Vec_IntForEachEntry( p->vWinObjs, iObj, i )
    {
        Vec_PtrPush( vSims, Sbd_ObjSim0(p, iObj) );
        if ( iObj == Pivot )
            break;
    }
    assert( i == PivotVar );
    // compute patterns
    RetValue = Sbd_ManCollectConstants( p->pSat, nCares, PivotVar, (word **)Vec_PtrArray(vSims), p->vLits );
    // print computed miterms
    if ( 0 && RetValue < 0 )
    {
        Vec_Int_t * vPis = Vec_WecEntry(p->vDivLevels, 0);
        int i, k, Ind;
        printf( "Additional minterms:\n" );
        Vec_IntForEachEntry( p->vLits, Ind, k )
        {
            for ( i = 0; i < Vec_IntSize(vPis); i++ )
                printf( "%d", Abc_TtGetBit( (word *)Vec_PtrEntry(vSims, Vec_IntEntry(p->vWinObjs, i)), Ind ) );
            printf( "\n" );
        }
    }
    Vec_PtrFree( vSims );
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    // set controlability of these minterms
    Vec_IntForEachEntry( p->vLits, Ind, i )
        Abc_TtSetBit( pCtrl, Ind );
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    // double check that we now have enough minterms
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
    assert( nCares[0] >= nMintCount && nCares[1] >= nMintCount );
    return -1;
}